

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal128.c
# Opt level: O1

char * decimal128ToString(decimal128 *d128,char *string)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  byte *pbVar12;
  ulong uVar13;
  
  uVar8 = *(uint *)d128->bytes;
  uVar1 = *(uint *)(d128->bytes + 4);
  uVar6 = *(uint *)(d128->bytes + 8);
  uVar2 = *(uint *)(d128->bytes + 0xc);
  pcVar10 = string;
  if ((int)uVar2 < 0) {
    pcVar10 = string + 1;
    *string = '-';
  }
  uVar13 = (ulong)(uVar2 >> 0x18 & 0x7c);
  iVar7 = *(int *)((long)COMBMSD + uVar13);
  iVar5 = *(int *)((long)COMBEXP + uVar13);
  if (iVar5 == 3) {
    if (iVar7 == 0) {
      builtin_strncpy(pcVar10,"Infinity",9);
      return string;
    }
    if ((uVar2 >> 0x19 & 1) != 0) {
      *pcVar10 = 's';
      pcVar10 = pcVar10 + 1;
    }
    builtin_strncpy(pcVar10,"NaN",4);
    pcVar10 = pcVar10 + 3;
    iVar5 = 0;
    if ((uVar8 == 0) && (uVar1 == 0)) {
      iVar7 = 0;
      if ((uVar2 & 0x3ffff) == 0 && uVar6 == 0) {
        return string;
      }
    }
    else {
      iVar7 = 0;
      iVar5 = 0;
    }
  }
  else {
    iVar5 = (uVar2 >> 0xe & 0xfff) + iVar5 * 0x1000 + -0x1820;
  }
  pcVar4 = pcVar10;
  if (iVar7 != 0) {
    pcVar4 = pcVar10 + 1;
    *pcVar10 = (char)iVar7 + '0';
  }
  lVar11 = (ulong)*(ushort *)((long)DPD2BIN + (ulong)(uVar2 >> 3 & 0x7fe)) * 4;
  if (pcVar4 == pcVar10) {
    uVar13 = (ulong)""[lVar11];
    if (uVar13 != 0) {
      pbVar12 = "" + lVar11 + (4 - uVar13);
      goto LAB_00b2f793;
    }
  }
  else {
    pbVar12 = "" + lVar11 + 1;
    uVar13 = 3;
LAB_00b2f793:
    *(undefined4 *)pcVar4 = *(undefined4 *)pbVar12;
    pcVar4 = pcVar4 + uVar13;
  }
  if (pcVar4 == pcVar10) {
    uVar13 = (ulong)""[(ulong)DPD2BIN[(uVar2 & 0xf) << 6 | uVar6 >> 0x1a] * 4];
    if (uVar13 != 0) {
      pbVar12 = "" + (ulong)DPD2BIN[(uVar2 & 0xf) << 6 | uVar6 >> 0x1a] * 4 + (4 - uVar13);
      goto LAB_00b2f7d8;
    }
  }
  else {
    pbVar12 = "" + (ulong)DPD2BIN[(uVar2 & 0xf) << 6 | uVar6 >> 0x1a] * 4 + 1;
    uVar13 = 3;
LAB_00b2f7d8:
    *(undefined4 *)pcVar4 = *(undefined4 *)pbVar12;
    pcVar4 = pcVar4 + uVar13;
  }
  lVar11 = (ulong)*(ushort *)((long)DPD2BIN + (ulong)(uVar6 >> 0xf & 0x7fe)) * 4;
  if (pcVar4 == pcVar10) {
    uVar13 = (ulong)""[lVar11];
    if (uVar13 != 0) {
      pbVar12 = "" + lVar11 + (4 - uVar13);
      goto LAB_00b2f81f;
    }
  }
  else {
    pbVar12 = "" + lVar11 + 1;
    uVar13 = 3;
LAB_00b2f81f:
    *(undefined4 *)pcVar4 = *(undefined4 *)pbVar12;
    pcVar4 = pcVar4 + uVar13;
  }
  lVar11 = (ulong)*(ushort *)((long)DPD2BIN + (ulong)(uVar6 >> 5 & 0x7fe)) * 4;
  if (pcVar4 == pcVar10) {
    uVar13 = (ulong)""[lVar11];
    if (uVar13 != 0) {
      pbVar12 = "" + lVar11 + (4 - uVar13);
      goto LAB_00b2f866;
    }
  }
  else {
    pbVar12 = "" + lVar11 + 1;
    uVar13 = 3;
LAB_00b2f866:
    *(undefined4 *)pcVar4 = *(undefined4 *)pbVar12;
    pcVar4 = pcVar4 + uVar13;
  }
  if (pcVar4 == pcVar10) {
    uVar13 = (ulong)""[(ulong)DPD2BIN[(uVar6 & 0x3f) << 4 | uVar1 >> 0x1c] * 4];
    if (uVar13 != 0) {
      pbVar12 = "" + (ulong)DPD2BIN[(uVar6 & 0x3f) << 4 | uVar1 >> 0x1c] * 4 + (4 - uVar13);
      goto LAB_00b2f8ab;
    }
  }
  else {
    pbVar12 = "" + (ulong)DPD2BIN[(uVar6 & 0x3f) << 4 | uVar1 >> 0x1c] * 4 + 1;
    uVar13 = 3;
LAB_00b2f8ab:
    *(undefined4 *)pcVar4 = *(undefined4 *)pbVar12;
    pcVar4 = pcVar4 + uVar13;
  }
  lVar11 = (ulong)*(ushort *)((long)DPD2BIN + (ulong)(uVar1 >> 0x11 & 0x7fe)) * 4;
  if (pcVar4 == pcVar10) {
    uVar13 = (ulong)""[lVar11];
    if (uVar13 != 0) {
      pbVar12 = "" + lVar11 + (4 - uVar13);
      goto LAB_00b2f8f2;
    }
  }
  else {
    pbVar12 = "" + lVar11 + 1;
    uVar13 = 3;
LAB_00b2f8f2:
    *(undefined4 *)pcVar4 = *(undefined4 *)pbVar12;
    pcVar4 = pcVar4 + uVar13;
  }
  lVar11 = (ulong)*(ushort *)((long)DPD2BIN + (ulong)(uVar1 >> 7 & 0x7fe)) * 4;
  if (pcVar4 == pcVar10) {
    uVar13 = (ulong)""[lVar11];
    if (uVar13 != 0) {
      pbVar12 = "" + lVar11 + (4 - uVar13);
      goto LAB_00b2f939;
    }
  }
  else {
    pbVar12 = "" + lVar11 + 1;
    uVar13 = 3;
LAB_00b2f939:
    *(undefined4 *)pcVar4 = *(undefined4 *)pbVar12;
    pcVar4 = pcVar4 + uVar13;
  }
  if (pcVar4 == pcVar10) {
    uVar13 = (ulong)""[(ulong)DPD2BIN[(uVar1 & 0xff) << 2 | uVar8 >> 0x1e] * 4];
    if (uVar13 != 0) {
      pbVar12 = "" + (ulong)DPD2BIN[(uVar1 & 0xff) << 2 | uVar8 >> 0x1e] * 4 + (4 - uVar13);
      goto LAB_00b2f97e;
    }
  }
  else {
    pbVar12 = "" + (ulong)DPD2BIN[(uVar1 & 0xff) << 2 | uVar8 >> 0x1e] * 4 + 1;
    uVar13 = 3;
LAB_00b2f97e:
    *(undefined4 *)pcVar4 = *(undefined4 *)pbVar12;
    pcVar4 = pcVar4 + uVar13;
  }
  lVar11 = (ulong)*(ushort *)((long)DPD2BIN + (ulong)(uVar8 >> 0x13 & 0x7fe)) * 4;
  if (pcVar4 == pcVar10) {
    uVar13 = (ulong)""[lVar11];
    if (uVar13 != 0) {
      pbVar12 = "" + lVar11 + (4 - uVar13);
      goto LAB_00b2f9c5;
    }
  }
  else {
    pbVar12 = "" + lVar11 + 1;
    uVar13 = 3;
LAB_00b2f9c5:
    *(undefined4 *)pcVar4 = *(undefined4 *)pbVar12;
    pcVar4 = pcVar4 + uVar13;
  }
  lVar11 = (ulong)*(ushort *)((long)DPD2BIN + (ulong)(uVar8 >> 9 & 0x7fe)) * 4;
  if (pcVar4 == pcVar10) {
    uVar13 = (ulong)""[lVar11];
    if (uVar13 != 0) {
      pbVar12 = "" + lVar11 + (4 - uVar13);
      goto LAB_00b2fa0c;
    }
  }
  else {
    pbVar12 = "" + lVar11 + 1;
    uVar13 = 3;
LAB_00b2fa0c:
    *(undefined4 *)pcVar4 = *(undefined4 *)pbVar12;
    pcVar4 = pcVar4 + uVar13;
  }
  if (pcVar4 == pcVar10) {
    uVar13 = (ulong)""[(ulong)DPD2BIN[uVar8 & 0x3ff] * 4];
    if (uVar13 == 0) goto LAB_00b2fa4e;
    pbVar12 = "" + (ulong)DPD2BIN[uVar8 & 0x3ff] * 4 + (4 - uVar13);
  }
  else {
    pbVar12 = "" + (ulong)DPD2BIN[uVar8 & 0x3ff] * 4 + 1;
    uVar13 = 3;
  }
  *(undefined4 *)pcVar4 = *(undefined4 *)pbVar12;
  pcVar4 = pcVar4 + uVar13;
LAB_00b2fa4e:
  if (pcVar4 == pcVar10) {
    *pcVar4 = '0';
    pcVar4 = pcVar4 + 1;
  }
  if (iVar5 != 0) {
    iVar7 = (int)pcVar4 - (int)pcVar10;
    uVar8 = iVar5 + iVar7;
    uVar6 = iVar5 + -1 + iVar7;
    uVar1 = 1;
    if (-6 < (int)uVar8 && iVar5 < 1) {
      uVar6 = 0;
      uVar1 = uVar8;
    }
    pcVar9 = pcVar4 + -1;
    if ((int)uVar1 < 1) {
      pcVar4[2 - (long)(int)uVar1] = '\0';
      if (pcVar10 <= pcVar9) {
        do {
          pcVar9[2 - (long)(int)uVar1] = *pcVar9;
          pcVar9 = pcVar9 + -1;
        } while (pcVar10 <= pcVar9);
      }
      pcVar10[0] = '0';
      pcVar10[1] = '.';
      if (-1 < (int)uVar1) {
        return string;
      }
      memset(pcVar10 + 2,0x30,(ulong)-uVar1);
      return string;
    }
    pcVar3 = pcVar4;
    if (pcVar10 + uVar1 < pcVar4) {
      while (pcVar10 + uVar1 <= pcVar9) {
        *pcVar3 = pcVar3[-1];
        pcVar9 = pcVar3 + -2;
        pcVar3 = pcVar3 + -1;
      }
      *pcVar3 = '.';
      pcVar4 = pcVar4 + 1;
    }
    if (uVar6 != 0) {
      pcVar4[0] = 'E';
      pcVar4[1] = '+';
      if ((int)uVar6 < 0) {
        pcVar4[1] = '-';
        uVar6 = -uVar6;
      }
      if ((int)uVar6 < 1000) {
        uVar13 = (ulong)""[(ulong)uVar6 * 4];
        *(undefined4 *)(pcVar4 + 2) = *(undefined4 *)("" + (ulong)uVar6 * 4 + (4 - uVar13));
        pcVar4 = pcVar4 + 2 + uVar13;
      }
      else {
        uVar8 = (uVar6 >> 3) * 0x419 >> 0x11;
        pcVar4[2] = (char)uVar8 + '0';
        *(undefined4 *)(pcVar4 + 3) =
             *(undefined4 *)("" + (long)(int)(uVar8 * -1000 + uVar6) * 4 + 1);
        pcVar4 = pcVar4 + 6;
      }
    }
  }
  *pcVar4 = '\0';
  return string;
}

Assistant:

char * decimal128ToString(const decimal128 *d128, char *string){
  uInt msd;			   /* coefficient MSD */
  Int  exp;			   /* exponent top two bits or full */
  uInt comb;			   /* combination field */
  char *cstart;			   /* coefficient start */
  char *c;			   /* output pointer in string */
  const uInt *pu;		   /* work */
  char *s, *t;			   /* .. (source, target) */
  Int  dpd;			   /* .. */
  Int  pre, e;			   /* .. */
  const uByte *u;		   /* .. */

  uInt sourar[4];		   /* source 128-bit */
  #define sourhi sourar[3]	   /* name the word with the sign */
  #define sourmh sourar[2]	   /* and the mid-high word */
  #define sourml sourar[1]	   /* and the mod-low word */
  #define sourlo sourar[0]	   /* and the lowest word */

  /* load source from storage; this is endian */
  pu=(const uInt *)d128->bytes;	   /* overlay */
  if (DECLITEND) {
    sourlo=pu[0];		   /* directly load the low int */
    sourml=pu[1];		   /* then the mid-low */
    sourmh=pu[2];		   /* then the mid-high */
    sourhi=pu[3];		   /* then the high int */
    }
   else {
    sourhi=pu[0];		   /* directly load the high int */
    sourmh=pu[1];		   /* then the mid-high */
    sourml=pu[2];		   /* then the mid-low */
    sourlo=pu[3];		   /* then the low int */
    }

  c=string;			   /* where result will go */
  if (((Int)sourhi)<0) *c++='-';   /* handle sign */

  comb=(sourhi>>26)&0x1f;	   /* combination field */
  msd=COMBMSD[comb];		   /* decode the combination field */
  exp=COMBEXP[comb];		   /* .. */

  if (exp==3) {
    if (msd==0) {		   /* infinity */
      strcpy(c,	  "Inf");
      strcpy(c+3, "inity");
      return string;		   /* easy */
      }
    if (sourhi&0x02000000) *c++='s'; /* sNaN */
    strcpy(c, "NaN");		   /* complete word */
    c+=3;			   /* step past */
    if (sourlo==0 && sourml==0 && sourmh==0
     && (sourhi&0x0003ffff)==0) return string; /* zero payload */
    /* otherwise drop through to add integer; set correct exp */
    exp=0; msd=0;		   /* setup for following code */
    }
   else exp=(exp<<12)+((sourhi>>14)&0xfff)-DECIMAL128_Bias; /* unbiased */

  /* convert 34 digits of significand to characters */
  cstart=c;			   /* save start of coefficient */
  if (msd) *c++='0'+(char)msd;	   /* non-zero most significant digit */

  /* Now decode the declets.  After extracting each one, it is */
  /* decoded to binary and then to a 4-char sequence by table lookup; */
  /* the 4-chars are a 1-char length (significant digits, except 000 */
  /* has length 0).  This allows us to left-align the first declet */
  /* with non-zero content, then remaining ones are full 3-char */
  /* length.  We use fixed-length memcpys because variable-length */
  /* causes a subroutine call in GCC.  (These are length 4 for speed */
  /* and are safe because the array has an extra terminator byte.) */
  #define dpd2char u=&BIN2CHAR[DPD2BIN[dpd]*4];			  \
		   if (c!=cstart) {memcpy(c, u+1, 4); c+=3;}	  \
		    else if (*u)  {memcpy(c, u+4-*u, 4); c+=*u;}
  dpd=(sourhi>>4)&0x3ff;		     /* declet 1 */
  dpd2char;
  dpd=((sourhi&0xf)<<6) | (sourmh>>26);	     /* declet 2 */
  dpd2char;
  dpd=(sourmh>>16)&0x3ff;		     /* declet 3 */
  dpd2char;
  dpd=(sourmh>>6)&0x3ff;		     /* declet 4 */
  dpd2char;
  dpd=((sourmh&0x3f)<<4) | (sourml>>28);     /* declet 5 */
  dpd2char;
  dpd=(sourml>>18)&0x3ff;		     /* declet 6 */
  dpd2char;
  dpd=(sourml>>8)&0x3ff;		     /* declet 7 */
  dpd2char;
  dpd=((sourml&0xff)<<2) | (sourlo>>30);     /* declet 8 */
  dpd2char;
  dpd=(sourlo>>20)&0x3ff;		     /* declet 9 */
  dpd2char;
  dpd=(sourlo>>10)&0x3ff;		     /* declet 10 */
  dpd2char;
  dpd=(sourlo)&0x3ff;			     /* declet 11 */
  dpd2char;

  if (c==cstart) *c++='0';	   /* all zeros -- make 0 */

  if (exp==0) {			   /* integer or NaN case -- easy */
    *c='\0';			   /* terminate */
    return string;
    }

  /* non-0 exponent */
  e=0;				   /* assume no E */
  pre=c-cstart+exp;
  /* [here, pre-exp is the digits count (==1 for zero)] */
  if (exp>0 || pre<-5) {	   /* need exponential form */
    e=pre-1;			   /* calculate E value */
    pre=1;			   /* assume one digit before '.' */
    } /* exponential form */

  /* modify the coefficient, adding 0s, '.', and E+nn as needed */
  s=c-1;			   /* source (LSD) */
  if (pre>0) {			   /* ddd.ddd (plain), perhaps with E */
    char *dotat=cstart+pre;
    if (dotat<c) {		   /* if embedded dot needed... */
      t=c;				/* target */
      for (; s>=dotat; s--, t--) *t=*s; /* open the gap; leave t at gap */
      *t='.';				/* insert the dot */
      c++;				/* length increased by one */
      }

    /* finally add the E-part, if needed; it will never be 0, and has */
    /* a maximum length of 4 digits */
    if (e!=0) {
      *c++='E';			   /* starts with E */
      *c++='+';			   /* assume positive */
      if (e<0) {
	*(c-1)='-';		   /* oops, need '-' */
	e=-e;			   /* uInt, please */
	}
      if (e<1000) {		   /* 3 (or fewer) digits case */
	u=&BIN2CHAR[e*4];	   /* -> length byte */
	memcpy(c, u+4-*u, 4);	   /* copy fixed 4 characters [is safe] */
	c+=*u;			   /* bump pointer appropriately */
	}
       else {			   /* 4-digits */
	Int thou=((e>>3)*1049)>>17; /* e/1000 */
	Int rem=e-(1000*thou);	    /* e%1000 */
	*c++='0'+(char)thou;
	u=&BIN2CHAR[rem*4];	   /* -> length byte */
	memcpy(c, u+1, 4);	   /* copy fixed 3+1 characters [is safe] */
	c+=3;			   /* bump pointer, always 3 digits */
	}
      }
    *c='\0';			   /* add terminator */
    /*printf("res %s\n", string); */
    return string;
    } /* pre>0 */

  /* -5<=pre<=0: here for plain 0.ddd or 0.000ddd forms (can never have E) */
  t=c+1-pre;
  *(t+1)='\0';				/* can add terminator now */
  for (; s>=cstart; s--, t--) *t=*s;	/* shift whole coefficient right */
  c=cstart;
  *c++='0';				/* always starts with 0. */
  *c++='.';
  for (; pre<0; pre++) *c++='0';	/* add any 0's after '.' */
  /*printf("res %s\n", string); */
  return string;
  }